

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O3

int socket_server_poll(socket_server *ss,socket_message *result,int *more)

{
  __fd_mask *p_Var1;
  byte bVar2;
  short sVar3;
  uint16_t uVar4;
  void *pvVar5;
  uintptr_t uVar6;
  undefined2 uVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  socket *psVar12;
  uintptr_t *puVar13;
  ulong uVar14;
  ssize_t sVar15;
  socket *psVar16;
  int *piVar17;
  char *pcVar18;
  char *pcVar19;
  int iVar20;
  _Bool *p_Var21;
  event *peVar22;
  addrinfo *paVar23;
  long lVar24;
  uint8_t *udp_address;
  size_t sVar25;
  bool bVar26;
  addrinfo *ai_list;
  sockaddr_all u;
  socklen_t len;
  uint8_t buffer [256];
  byte local_3ca;
  byte local_3c9;
  socket *local_3c8;
  addrinfo *local_3c0;
  char *local_3b8;
  int local_3b0;
  undefined1 local_3ac [12];
  char *local_3a0;
  uint8_t *local_398;
  event *local_390;
  undefined1 local_388 [8];
  epoll_data_t eStack_380;
  undefined8 local_378;
  sockaddr *psStack_370;
  char *local_368;
  addrinfo *paStack_360;
  socklen_t local_358 [4];
  _Bool *local_348;
  int *local_340;
  request_send local_338;
  undefined4 local_328;
  undefined4 uStack_324;
  
  local_3c8 = ss->slot;
  local_3b8 = ss->buffer;
  local_390 = ss->ev;
  local_398 = ss->udpbuffer;
  local_348 = &ss->ev[0].write;
  local_340 = more;
LAB_0010fe20:
  do {
    do {
      iVar9 = ss->checkctrl;
      while (iVar9 != 0) {
        local_338.id._0_2_ = 0;
        local_338.id._2_2_ = 0;
        local_338.sz._0_1_ = 0;
        local_338.sz._1_2_ = 0;
        local_338._7_4_ = 0;
        local_338.buffer._3_1_ = 0;
        local_338.buffer._4_4_ = 0;
        iVar9 = ss->recvctrl_fd;
        iVar11 = iVar9 + 0x3f;
        if (-1 < iVar9) {
          iVar11 = iVar9;
        }
        p_Var1 = (ss->rfds).__fds_bits + (iVar11 >> 6);
        *p_Var1 = *p_Var1 | 1L << ((byte)(iVar9 % 0x40) & 0x3f);
        iVar9 = select(iVar9 + 1,(fd_set *)&ss->rfds,(fd_set *)0x0,(fd_set *)0x0,
                       (timeval *)&local_338);
        if (iVar9 != 1) {
          ss->checkctrl = 0;
          break;
        }
        iVar9 = ss->recvctrl_fd;
        block_readpipe(iVar9,&local_3ca,2);
        bVar2 = local_3ca;
        uVar14 = (ulong)local_3ca;
        block_readpipe(iVar9,&local_338,(uint)local_3c9);
        uVar8 = (ushort)local_338.id;
        switch(bVar2) {
        case 0x41:
          iVar9 = 0;
          udp_address = (uint8_t *)&local_328;
          goto LAB_0010ffd0;
        case 0x42:
          result->id = CONCAT22(local_338.id._2_2_,(ushort)local_338.id);
          uVar6 = CONCAT44(local_338.buffer._4_4_,
                           CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_));
          result->opaque = uVar6;
          result->ud = 0;
          iVar9 = CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz));
          psVar12 = new_fd(ss,CONCAT22(local_338.id._2_2_,(ushort)local_338.id),iVar9,0,uVar6,true);
          if (psVar12 == (socket *)0x0) {
            iVar9 = 4;
            pcVar19 = "reach skynet socket number limit";
          }
          else {
            sp_nonblocking(iVar9);
            psVar12->type = 8;
            iVar9 = 2;
            pcVar19 = "binding";
          }
          goto LAB_00110a63;
        case 0x43:
          if ((*(short *)((long)&local_3c8->type + (ulong)((uint)(ushort)local_338.id * 0x50)) != 0)
             && (puVar13 = (uintptr_t *)
                           ((long)&local_3c8->opaque + (ulong)((uint)(ushort)local_338.id * 0x50)),
                *(int *)((long)puVar13 + 0x34) == CONCAT22(local_338.id._2_2_,(ushort)local_338.id))
             ) {
            if ((ushort)puVar13[7] != (ushort)(byte)local_338.sz) {
              result->opaque = *puVar13;
              result->id = CONCAT22(local_338.id._2_2_,(ushort)local_338.id);
              result->ud = 0;
              result->data = "protocol mismatch";
              goto LAB_00110ae8;
            }
            if ((byte)local_338.sz == 1) {
              *(undefined4 *)((long)puVar13 + 0x3f) = local_338._7_4_;
              *(undefined4 *)((long)puVar13 + 0x3c) =
                   CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,1));
            }
            else {
              *(uint *)((long)puVar13 + 0x4b) = CONCAT31((undefined3)uStack_324,local_328._3_1_);
              *(undefined4 *)((long)puVar13 + 0x3c) =
                   CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz));
              *(uint *)(puVar13 + 8) = CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_);
              *(undefined4 *)((long)puVar13 + 0x44) = local_338.buffer._4_4_;
              *(undefined4 *)(puVar13 + 9) = local_328;
            }
          }
          break;
        case 0x44:
          iVar9 = 0;
          goto LAB_0010ffcd;
        default:
          fprintf(_stderr,"socket-server: Unknown ctrl %c.\n",uVar14);
          break;
        case 0x4b:
          iVar11 = CONCAT22(local_338.id._2_2_,(ushort)local_338.id);
          if ((*(short *)((long)&local_3c8->type + (ulong)((uint)(ushort)local_338.id * 0x50)) == 0)
             || (psVar12 = (socket *)
                           ((long)&local_3c8->opaque + (ulong)((uint)(ushort)local_338.id * 0x50)),
                psVar12->id != iVar11)) {
            result->id = iVar11;
            result->opaque =
                 CONCAT44(local_338.buffer._4_4_,
                          CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_));
            result->ud = 0;
            result->data = (char *)0x0;
          }
          else {
            if (((psVar12->high).head != (write_buffer *)0x0) ||
               ((psVar12->low).head != (write_buffer *)0x0)) {
              iVar9 = send_buffer(ss,psVar12,result);
              if (iVar9 != -1) goto LAB_00110a67;
              if (((psVar12->high).head != (write_buffer *)0x0) ||
                 ((psVar12->low).head != (write_buffer *)0x0)) {
                psVar12->type = 6;
                break;
              }
            }
            force_close(ss,psVar12,result);
            result->id = iVar11;
            result->opaque =
                 CONCAT44(local_338.buffer._4_4_,
                          CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_));
          }
          iVar9 = 1;
          goto LAB_00110a67;
        case 0x4c:
          iVar9 = CONCAT22(local_338.id._2_2_,(ushort)local_338.id);
          iVar11 = CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz));
          uVar6 = CONCAT44(local_338.buffer._4_4_,
                           CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_));
          psVar12 = new_fd(ss,iVar9,iVar11,0,uVar6,false);
          if (psVar12 == (socket *)0x0) {
            close(iVar11);
            result->opaque = uVar6;
            result->id = iVar9;
            result->ud = 0;
            result->data = "reach skynet socket number limit";
            *(undefined2 *)((long)&local_3c8->type + (ulong)((uint)uVar8 * 0x50)) = 0;
LAB_00110ae8:
            iVar9 = 4;
            goto LAB_00110a67;
          }
          psVar12->type = 2;
          break;
        case 0x4f:
          iVar9 = CONCAT22(local_338.id._2_2_,(ushort)local_338.id);
          result->opaque =
               CONCAT44(local_338.buffer._4_4_,
                        CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_));
          result->id = iVar9;
          result->ud = 0;
          result->data = (char *)0x0;
          local_3c0 = (addrinfo *)0x0;
          sprintf((char *)local_358,"%d",
                  (ulong)CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz)
                                 ));
          local_388._0_2_ = 0;
          local_388._2_2_ = 0;
          local_388._4_4_ = 0;
          local_378._0_4_ = 0;
          local_378._4_4_ = 0;
          psStack_370 = (sockaddr *)0x0;
          local_368 = (char *)0x0;
          paStack_360 = (addrinfo *)0x0;
          eStack_380.fd = 1;
          eStack_380.u64._4_4_ = 6;
          iVar11 = getaddrinfo((char *)&local_328,(char *)local_358,(addrinfo *)local_388,&local_3c0
                              );
          paVar23 = local_3c0;
          if (iVar11 == 0) {
            for (; paVar23 != (addrinfo *)0x0; paVar23 = paVar23->ai_next) {
              iVar11 = socket(paVar23->ai_family,paVar23->ai_socktype,paVar23->ai_protocol);
              if (-1 < iVar11) {
                local_3ac._0_4_ = 1;
                setsockopt(iVar11,1,9,local_3ac,4);
                sp_nonblocking(iVar11);
                iVar20 = connect(iVar11,paVar23->ai_addr,paVar23->ai_addrlen);
                if (iVar20 == 0) {
                  psVar12 = new_fd(ss,iVar9,iVar11,0,
                                   CONCAT44(local_338.buffer._4_4_,
                                            CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_))
                                   ,true);
                  pcVar19 = local_3b8;
                  if (psVar12 != (socket *)0x0) {
                    psVar12->type = 5;
                    pcVar18 = inet_ntop(paVar23->ai_family,
                                        paVar23->ai_addr->sa_data +
                                        (ulong)(paVar23->ai_family != 2) * 4 + 2,local_3b8,0x80);
                    if (pcVar18 != (char *)0x0) {
                      result->data = pcVar19;
                    }
                    freeaddrinfo(local_3c0);
                    iVar9 = 2;
                    goto LAB_001102d1;
                  }
                }
                else {
                  piVar17 = __errno_location();
                  if (*piVar17 != 0x73) {
                    close(iVar11);
                    goto LAB_00110290;
                  }
                  psVar12 = new_fd(ss,iVar9,iVar11,0,
                                   CONCAT44(local_338.buffer._4_4_,
                                            CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_))
                                   ,true);
                  if (psVar12 != (socket *)0x0) {
                    psVar12->type = 4;
                    local_3ac._0_4_ = 5;
                    local_3ac._4_8_ = psVar12;
                    epoll_ctl(ss->event_fd,3,psVar12->fd,(epoll_event *)local_3ac);
                    freeaddrinfo(local_3c0);
                    iVar9 = -1;
                    goto LAB_001102d1;
                  }
                }
                close(iVar11);
                pcVar19 = "reach skynet socket number limit";
                goto LAB_001102a6;
              }
LAB_00110290:
            }
            piVar17 = __errno_location();
            pcVar19 = strerror(*piVar17);
          }
          else {
            pcVar19 = gai_strerror(iVar11);
          }
LAB_001102a6:
          result->data = pcVar19;
          freeaddrinfo(local_3c0);
          *(undefined2 *)((long)&local_3c8->type + (ulong)((uint)uVar8 * 0x50)) = 0;
          iVar9 = 4;
          goto LAB_001102d1;
        case 0x50:
          iVar9 = 1;
LAB_0010ffcd:
          udp_address = (uint8_t *)0x0;
LAB_0010ffd0:
          iVar9 = send_socket(ss,&local_338,result,iVar9,udp_address);
LAB_001102d1:
          if (iVar9 != -1) goto LAB_00110a67;
          break;
        case 0x53:
          result->id = CONCAT22(local_338.id._2_2_,(ushort)local_338.id);
          uVar6 = CONCAT44(local_338.buffer._4_4_,
                           CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_));
          result->opaque = uVar6;
          result->ud = 0;
          result->data = (char *)0x0;
          sVar3 = *(short *)((long)&local_3c8->type + (ulong)((uint)(ushort)local_338.id * 0x50));
          iVar9 = 4;
          if ((sVar3 == 0) ||
             (puVar13 = (uintptr_t *)
                        ((long)&local_3c8->opaque + (ulong)((uint)(ushort)local_338.id * 0x50)),
             *(int *)((long)puVar13 + 0x34) != CONCAT22(local_338.id._2_2_,(ushort)local_338.id))) {
            pcVar19 = "invalid socket";
          }
          else {
            if (sVar3 != 7) {
              if (sVar3 == 5) {
                *puVar13 = uVar6;
                iVar9 = 2;
                pcVar19 = "transfer";
                goto LAB_00110a63;
              }
              if (sVar3 != 2) break;
            }
            local_388._0_2_ = 1;
            local_388[2] = '\0';
            local_388[3] = '\0';
            unique0x10001532 = puVar13;
            iVar11 = epoll_ctl(ss->event_fd,1,(int)puVar13[6],(epoll_event *)local_388);
            if (iVar11 == -1) {
              *(undefined2 *)((long)puVar13 + 0x3a) = 0;
              piVar17 = __errno_location();
              pcVar19 = strerror(*piVar17);
            }
            else {
              bVar26 = *(short *)((long)puVar13 + 0x3a) == 7;
              *(ushort *)((long)puVar13 + 0x3a) = bVar26 + 3 + (ushort)bVar26;
              *puVar13 = CONCAT44(local_338.buffer._4_4_,
                                  CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_));
              iVar9 = 2;
              pcVar19 = "start";
            }
          }
LAB_00110a63:
          result->data = pcVar19;
LAB_00110a67:
          if ((iVar9 != 4) && (iVar9 != 1)) {
            return iVar9;
          }
          iVar11 = ss->event_index;
          if (ss->event_n <= iVar11) {
            return iVar9;
          }
          iVar20 = ss->event_n - iVar11;
          peVar22 = ss->ev + iVar11;
          while (((pvVar5 = peVar22->s, pvVar5 == (void *)0x0 ||
                  (*(short *)((long)pvVar5 + 0x3a) != 0)) ||
                 (*(int *)((long)pvVar5 + 0x34) != result->id))) {
            peVar22 = peVar22 + 1;
            iVar20 = iVar20 + -1;
            if (iVar20 == 0) {
              return iVar9;
            }
          }
          peVar22->s = (void *)0x0;
          return iVar9;
        case 0x54:
          uVar14 = (ulong)((uint)(ushort)local_338.id * 0x50);
          if ((*(short *)((long)&local_3c8->type + uVar14) != 0) &&
             (*(int *)((long)&local_3c8->id + uVar14) ==
              CONCAT22(local_338.id._2_2_,(ushort)local_338.id))) {
            local_388._0_2_ = local_338.buffer._0_2_;
            local_388._2_2_ =
                 (undefined2)(CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_) >> 0x10);
            setsockopt(*(int *)((long)&local_3c8->fd + uVar14),6,
                       CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz)),
                       local_388,4);
          }
          break;
        case 0x55:
          iVar9 = CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz));
          psVar12 = new_fd(ss,CONCAT22(local_338.id._2_2_,(ushort)local_338.id),iVar9,
                           (CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_) == 10) + 1,
                           CONCAT44(uStack_324,local_328),true);
          if (psVar12 == (socket *)0x0) {
            close(iVar9);
            *(undefined2 *)((long)&local_3c8->type + (ulong)((uint)uVar8 * 0x50)) = 0;
          }
          else {
            psVar12->type = 5;
            *(undefined8 *)&psVar12->p = 0;
            *(undefined8 *)((long)&psVar12->p + 8) = 0;
            *(undefined4 *)((long)&psVar12->p + 0xf) = 0;
          }
          break;
        case 0x58:
          result->opaque = 0;
          result->id = 0;
          result->ud = 0;
          result->data = (char *)0x0;
          iVar9 = 5;
          goto LAB_00110a67;
        }
        iVar9 = ss->checkctrl;
      }
      iVar9 = ss->event_index;
      if (iVar9 == ss->event_n) {
        uVar10 = epoll_wait(ss->event_fd,(epoll_event *)&local_338,0x40,-1);
        if (0 < (int)uVar10) {
          lVar24 = 0;
          p_Var21 = local_348;
          do {
            ((event *)(p_Var21 + -9))->s = *(void **)((long)&local_338.sz + lVar24);
            bVar2 = *(byte *)((long)&local_338.id + lVar24);
            *p_Var21 = (_Bool)(bVar2 >> 2 & 1);
            p_Var21[-1] = (_Bool)(bVar2 & 1);
            lVar24 = lVar24 + 0xc;
            p_Var21 = p_Var21 + 0x10;
          } while ((ulong)uVar10 * 0xc != lVar24);
        }
        ss->event_n = uVar10;
        ss->checkctrl = 1;
        if (local_340 != (int *)0x0) {
          *local_340 = 0;
          uVar10 = ss->event_n;
        }
        ss->event_index = 0;
        iVar9 = 0;
        if ((int)uVar10 < 1) {
          ss->event_n = 0;
          return -1;
        }
      }
      peVar22 = local_390;
      ss->event_index = iVar9 + 1;
      psVar12 = (socket *)local_390[iVar9].s;
    } while (psVar12 == (socket *)0x0);
    uVar4 = psVar12->type;
    if (uVar4 == 3) {
      local_358[0] = 0x1c;
      iVar9 = accept(psVar12->fd,(sockaddr *)local_388,local_358);
      if (iVar9 < 0) {
        piVar17 = __errno_location();
        if (*piVar17 - 0x17U < 2) {
          result->opaque = psVar12->opaque;
          result->id = psVar12->id;
          result->ud = 0;
          pcVar19 = strerror(*piVar17);
          result->data = pcVar19;
          return 4;
        }
      }
      else {
        iVar11 = reserve_id(ss);
        if (-1 < iVar11) {
          local_338.id._0_2_ = 1;
          local_338.id._2_2_ = 0;
          setsockopt(iVar9,1,9,&local_338,4);
          sp_nonblocking(iVar9);
          psVar16 = new_fd(ss,iVar11,iVar9,0,psVar12->opaque,false);
          uVar7 = local_388._2_2_;
          if (psVar16 != (socket *)0x0) {
            psVar16->type = 7;
            result->opaque = psVar12->opaque;
            result->id = psVar12->id;
            result->ud = iVar11;
            result->data = (char *)0x0;
            pcVar18 = inet_ntop((uint)(ushort)local_388._0_2_,
                                local_388 + (ulong)((ushort)local_388._0_2_ != 2) * 4 + 4,
                                (char *)&local_338,0x2e);
            pcVar19 = local_3b8;
            if (pcVar18 != (char *)0x0) {
              snprintf(local_3b8,0x80,"%s:%d",&local_338,
                       (ulong)(ushort)(uVar7 << 8 | (ushort)uVar7 >> 8));
              result->data = pcVar19;
            }
            return 3;
          }
        }
        close(iVar9);
      }
      goto LAB_0010fe20;
    }
    if (uVar4 == 0) {
      socket_server_poll_cold_1();
    }
    else {
      if (uVar4 == 4) {
        local_358[0] = 4;
        iVar9 = getsockopt(psVar12->fd,1,4,local_388,local_358);
        if ((-1 < iVar9) && (CONCAT22(local_388._2_2_,local_388._0_2_) == 0)) {
          psVar12->type = 5;
          result->opaque = psVar12->opaque;
          result->id = psVar12->id;
          result->ud = 0;
          if (((psVar12->high).head == (write_buffer *)0x0) &&
             ((psVar12->low).head == (write_buffer *)0x0)) {
            local_338.id._0_2_ = 1;
            local_338.id._2_2_ = 0;
            local_338.sz._0_1_ = (byte)psVar12;
            local_338.sz._1_2_ = (undefined2)((ulong)psVar12 >> 8);
            local_338._7_4_ = SUB84((ulong)psVar12 >> 0x18,0);
            local_338.buffer._3_1_ = (undefined1)((ulong)psVar12 >> 0x38);
            epoll_ctl(ss->event_fd,3,psVar12->fd,(epoll_event *)&local_338);
          }
          local_3ac._0_4_ = 0x1c;
          iVar9 = getpeername(psVar12->fd,(sockaddr *)&local_338,(socklen_t *)local_3ac);
          pcVar19 = local_3b8;
          if ((iVar9 != 0) ||
             (pcVar18 = inet_ntop((uint)(ushort)local_338.id,
                                  &local_338.sz + ((ushort)local_338.id != 2),local_3b8,0x80),
             pcVar18 == (char *)0x0)) {
            pcVar19 = (char *)0x0;
          }
          result->data = pcVar19;
          return 2;
        }
        force_close(ss,psVar12,result);
        piVar17 = __errno_location();
        pcVar19 = strerror(*piVar17);
        result->data = pcVar19;
        return 4;
      }
      if (local_390[iVar9].read == true) {
        if (psVar12->protocol == 0) {
          local_3b0 = (psVar12->p).size;
          sVar25 = (size_t)local_3b0;
          local_3a0 = (char *)malloc(sVar25);
          sVar15 = read(psVar12->fd,local_3a0,sVar25);
          iVar11 = (int)sVar15;
          if (iVar11 < 0) {
            free(local_3a0);
            piVar17 = __errno_location();
            iVar11 = -1;
            bVar26 = true;
            if (*piVar17 == 4) goto LAB_00110793;
            if (*piVar17 != 0xb) {
              force_close(ss,psVar12,result);
              pcVar19 = strerror(*piVar17);
              result->data = pcVar19;
              goto LAB_00110718;
            }
            socket_server_poll_cold_2();
            goto LAB_001106c4;
          }
          if (iVar11 == 0) {
            free(local_3a0);
            force_close(ss,psVar12,result);
            iVar11 = 1;
            goto LAB_00110744;
          }
          if (psVar12->type == 6) {
            free(local_3a0);
            goto LAB_001106c4;
          }
          if (local_3b0 == iVar11) {
            iVar20 = (psVar12->p).size * 2;
LAB_00110771:
            (psVar12->p).size = iVar20;
          }
          else if ((0x40 < local_3b0) && (iVar11 * 2 < local_3b0)) {
            iVar20 = (psVar12->p).size / 2;
            goto LAB_00110771;
          }
          result->opaque = psVar12->opaque;
          result->id = psVar12->id;
          result->ud = iVar11;
          result->data = local_3a0;
          bVar26 = false;
          iVar11 = 0;
        }
        else {
          local_388._0_2_ = 0x1c;
          local_388._2_2_ = 0;
          sVar15 = recvfrom(psVar12->fd,local_398,0xffff,0,(sockaddr *)&local_338,
                            (socklen_t *)local_388);
          uVar10 = (uint)sVar15;
          if ((int)uVar10 < 0) {
            piVar17 = __errno_location();
            if ((*piVar17 != 4) && (*piVar17 != 0xb)) {
              force_close(ss,psVar12,result);
              pcVar19 = strerror(*piVar17);
              result->data = pcVar19;
LAB_00110718:
              iVar11 = 4;
LAB_00110744:
              bVar26 = false;
              goto LAB_00110793;
            }
          }
          else if (CONCAT22(local_388._2_2_,local_388._0_2_) == 0x10) {
            if (psVar12->protocol == 1) {
              pcVar19 = (char *)malloc((ulong)(uVar10 + 7));
              sVar25 = (size_t)(uVar10 & 0x7fffffff);
              pcVar19[sVar25] = '\x01';
              *(undefined2 *)(pcVar19 + sVar25 + 1) = local_338.id._2_2_;
              *(uint *)(pcVar19 + sVar25 + 3) =
                   CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz));
LAB_00110c85:
              memcpy(pcVar19,local_398,sVar25);
              result->opaque = psVar12->opaque;
              result->id = psVar12->id;
              result->ud = uVar10;
              result->data = pcVar19;
              ss->event_index = ss->event_index + -1;
              return 6;
            }
          }
          else if (psVar12->protocol == 2) {
            pcVar19 = (char *)malloc((ulong)(uVar10 + 0x13));
            sVar25 = (size_t)(uVar10 & 0x7fffffff);
            pcVar19[sVar25] = '\x02';
            *(undefined2 *)(pcVar19 + sVar25 + 1) = local_338.id._2_2_;
            *(ulong *)(pcVar19 + sVar25 + 3) =
                 CONCAT44(local_338.buffer._4_4_,
                          CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_));
            *(ulong *)(pcVar19 + sVar25 + 3 + 8) = CONCAT44(uStack_324,local_328);
            goto LAB_00110c85;
          }
LAB_001106c4:
          iVar11 = -1;
          bVar26 = true;
        }
LAB_00110793:
        if (peVar22[iVar9].write == true) {
          if (iVar11 == 1) {
            return 1;
          }
          if (iVar11 == 4) {
            return 4;
          }
          peVar22[iVar9].read = false;
          ss->event_index = ss->event_index + -1;
        }
        if (!bVar26) {
          return iVar11;
        }
      }
      else if ((local_390[iVar9].write == true) &&
              (iVar9 = send_buffer(ss,psVar12,result), iVar9 != -1)) {
        return iVar9;
      }
    }
  } while( true );
}

Assistant:

int 
socket_server_poll(struct socket_server *ss, struct socket_message * result, int * more) {
	for (;;) {
		if (ss->checkctrl) {
			if (has_cmd(ss)) {
				int type = ctrl_cmd(ss, result);
				if (type != -1) {
					clear_closed_event(ss, result, type);
					return type;
				} else
					continue;
			} else {
				ss->checkctrl = 0;
			}
		}
		if (ss->event_index == ss->event_n) {
			ss->event_n = sp_wait(ss->event_fd, ss->ev, MAX_EVENT);
			ss->checkctrl = 1;
			if (more) {
				*more = 0;
			}
			ss->event_index = 0;
			if (ss->event_n <= 0) {
				ss->event_n = 0;
				return -1;
			}
		}
		struct event *e = &ss->ev[ss->event_index++];
		struct socket *s = e->s;
		if (s == NULL) {
			// dispatch pipe message at beginning
			continue;
		}
		switch (s->type) {
		case SOCKET_TYPE_CONNECTING:
			return report_connect(ss, s, result);
		case SOCKET_TYPE_LISTEN: {
			int ok = report_accept(ss, s, result);
			if (ok > 0) {
				return SOCKET_ACCEPT;
			} if (ok < 0 ) {
				return SOCKET_ERROR;
			}
			// when ok == 0, retry
			break;
		}
		case SOCKET_TYPE_INVALID:
			fprintf(stderr, "socket-server: invalid socket\n");
			break;
		default:
			if (e->read) {
				int type;
				if (s->protocol == PROTOCOL_TCP) {
					type = forward_message_tcp(ss, s, result);
				} else {
					type = forward_message_udp(ss, s, result);
					if (type == SOCKET_UDP) {
						// try read again
						--ss->event_index;
						return SOCKET_UDP;
					}
				}
				if (e->write && type != SOCKET_CLOSE && type != SOCKET_ERROR) {
					// Try to dispatch write message next step if write flag set.
					e->read = false;
					--ss->event_index;
				}
				if (type == -1)
					break;				
				return type;
			}
			if (e->write) {
				int type = send_buffer(ss, s, result);
				if (type == -1)
					break;
				return type;
			}
			break;
		}
	}
}